

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<int,_QString>::emplace_helper<QString>
          (QMultiHash<int,_QString> *this,int *key,QString *args)

{
  long lVar1;
  piter it;
  Data<QHashPrivate::MultiNode<int,_QString>_> *in_RCX;
  int *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *n;
  Data<QHashPrivate::MultiNode<int,_QString>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::findOrInsert<int>
            (in_stack_ffffffffffffffc8,(int *)in_RSI);
  QHashPrivate::iterator<QHashPrivate::MultiNode<int,_QString>_>::node
            ((iterator<QHashPrivate::MultiNode<int,_QString>_> *)in_RCX);
  QHashPrivate::MultiNode<int,_QString>::createInPlace<QString>
            ((MultiNode<int,_QString> *)n,in_RDX,(QString *)in_RCX);
  (in_RSI->i).bucket = (in_RSI->i).bucket + 1;
  it.bucket = (size_t)in_RDX;
  it.d = in_RCX;
  iterator::iterator(in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }